

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int vcf_write_line(htsFile *fp,kstring_t *line)

{
  int iVar1;
  ssize_t sVar2;
  
  if (line->s[line->l - 1] != '\n') {
    kputc(10,line);
  }
  if ((fp->format).compression == no_compression) {
    sVar2 = hwrite((hFILE *)(fp->fp).bgzf,line->s,line->l);
    iVar1 = (int)sVar2;
  }
  else {
    sVar2 = bgzf_write((fp->fp).bgzf,line->s,line->l);
    iVar1 = (int)sVar2;
  }
  return -(uint)((long)iVar1 != line->l);
}

Assistant:

int vcf_write_line(htsFile *fp, kstring_t *line)
{
    int ret;
    if ( line->s[line->l-1]!='\n' ) kputc('\n',line);
    if ( fp->format.compression!=no_compression )
        ret = bgzf_write(fp->fp.bgzf, line->s, line->l);
    else
        ret = hwrite(fp->fp.hfile, line->s, line->l);
    return ret==line->l ? 0 : -1;
}